

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseAtan2(FScanner *sc,FName *identifier,PClassActor *cls)

{
  FxExpression *x;
  FxExpression *y;
  FxATan2 *this;
  FScriptPosition local_40;
  
  x = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  y = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x29);
  if (identifier->Index == 0xdd) {
    this = (FxATan2 *)operator_new(0x48);
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxATan2::FxATan2(this,x,y,&local_40);
  }
  else {
    this = (FxATan2 *)operator_new(0x48);
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxATan2::FxATan2(this,y,x,&local_40);
  }
  FString::~FString(&local_40.FileName);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseAtan2(FScanner &sc, FName identifier, PClassActor *cls)
{
	FxExpression *a = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *b = ParseExpressionM(sc, cls);
	sc.MustGetToken(')');
	return identifier == NAME_ATan2 ? new FxATan2(a, b, sc) : new FxATan2(b, a, sc);
}